

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtyperevision.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QTypeRevision *revision)

{
  byte bVar1;
  byte bVar2;
  _func_int **pp_Var3;
  storage_type *in_RCX;
  byte *in_RDX;
  QTextStream *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebugStateSaver local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_40,(QDebug *)revision);
  bVar1 = in_RDX[1];
  bVar2 = *in_RDX;
  if (bVar1 == 0xff) {
    if (bVar2 != 0xff) {
      QTextStream::operator<<(*(QTextStream **)revision,(uint)bVar2);
      goto LAB_00395287;
    }
    pQVar4 = *(QTextStream **)revision;
    *(undefined1 *)((long)&pQVar4[3]._vptr_QTextStream + 1) = 1;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"invalid";
    QString::fromUtf8(&local_38,(QString *)&DAT_00000007,ba_00);
    QTextStream::operator<<(pQVar4,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = *(QTextStream **)revision;
    if (*(char *)&pQVar4[3]._vptr_QTextStream != '\x01') goto LAB_0039529a;
  }
  else {
    pQVar4 = *(QTextStream **)revision;
    *(undefined1 *)&pQVar4[3]._vptr_QTextStream = 0;
    if (bVar2 == 0xff) {
      *(undefined1 *)((long)&pQVar4[3]._vptr_QTextStream + 1) = 1;
      QTextStream::operator<<(pQVar4,(uint)bVar1);
      if (*(char *)&(*(QTextStream **)revision)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)revision,' ');
      }
      pQVar4 = *(QTextStream **)revision;
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)".x";
      QString::fromUtf8(&local_38,(QString *)0x2,ba);
      QTextStream::operator<<(pQVar4,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QTextStream::operator<<(pQVar4,(uint)bVar1);
      if (*(char *)&(*(QTextStream **)revision)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)revision,' ');
      }
      QTextStream::operator<<(*(QTextStream **)revision,'.');
      if (*(char *)&(*(QTextStream **)revision)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)revision,' ');
      }
      QTextStream::operator<<(*(QTextStream **)revision,(uint)*in_RDX);
    }
LAB_00395287:
    pQVar4 = *(QTextStream **)revision;
    if (*(char *)&pQVar4[3]._vptr_QTextStream == '\0') goto LAB_0039529a;
  }
  QTextStream::operator<<(pQVar4,' ');
LAB_0039529a:
  pp_Var3 = *(_func_int ***)revision;
  *(undefined8 *)revision = 0;
  ((debug.stream)->ts)._vptr_QTextStream = pp_Var3;
  QDebugStateSaver::~QDebugStateSaver(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QTypeRevision &revision)
{
    QDebugStateSaver saver(debug);
    if (revision.hasMajorVersion()) {
        if (revision.hasMinorVersion())
            debug.nospace() << revision.majorVersion() << '.' << revision.minorVersion();
        else
            debug.nospace().noquote() << revision.majorVersion() << ".x";
    } else {
        if (revision.hasMinorVersion())
            debug << revision.minorVersion();
        else
            debug.noquote() << "invalid";
    }
    return debug;
}